

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlChar *PublicID,
                  xmlChar *SystemID)

{
  int iVar1;
  xmlHashEntry *pxVar2;
  xmlDictPtr pxVar3;
  xmlChar *pxVar4;
  xmlDictPtr local_58;
  xmlDictPtr dict;
  xmlHashTablePtr pxStack_48;
  int res;
  xmlNotationTablePtr table;
  xmlNotationPtr ret;
  xmlChar *SystemID_local;
  xmlChar *PublicID_local;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  xmlValidCtxtPtr ctxt_local;
  
  table = (xmlNotationTablePtr)0x0;
  if (dtd == (xmlDtdPtr)0x0) {
    return (xmlNotationPtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    return (xmlNotationPtr)0x0;
  }
  if ((PublicID == (xmlChar *)0x0) && (SystemID == (xmlChar *)0x0)) {
    return (xmlNotationPtr)0x0;
  }
  pxStack_48 = (xmlHashTablePtr)dtd->notations;
  if (pxStack_48 == (xmlHashTablePtr)0x0) {
    local_58 = (xmlDictPtr)0x0;
    if (dtd->doc != (_xmlDoc *)0x0) {
      local_58 = dtd->doc->dict;
    }
    pxStack_48 = xmlHashCreateDict(0,local_58);
    dtd->notations = pxStack_48;
    if (pxStack_48 == (xmlHashTablePtr)0x0) goto LAB_00177507;
  }
  table = (xmlNotationTablePtr)(*xmlMalloc)(0x18);
  if (table != (xmlNotationTablePtr)0x0) {
    memset(table,0,0x18);
    pxVar2 = (xmlHashEntry *)xmlStrdup(name);
    table->table = pxVar2;
    if (table->table != (xmlHashEntry *)0x0) {
      if (SystemID != (xmlChar *)0x0) {
        pxVar3 = (xmlDictPtr)xmlStrdup(SystemID);
        table->dict = pxVar3;
        if (table->dict == (xmlDictPtr)0x0) goto LAB_00177507;
      }
      if (PublicID != (xmlChar *)0x0) {
        pxVar4 = xmlStrdup(PublicID);
        *(xmlChar **)&table->size = pxVar4;
        if (*(xmlChar **)&table->size == (xmlChar *)0x0) goto LAB_00177507;
      }
      iVar1 = xmlHashAdd(pxStack_48,name,table);
      if (0 < iVar1) {
        return (xmlNotationPtr)table;
      }
      if (-1 < iVar1) {
        xmlErrValid(ctxt,XML_DTD_NOTATION_REDEFINED,"xmlAddNotationDecl: %s already defined\n",
                    (char *)name);
        xmlFreeNotation((xmlNotationPtr)table);
        return (xmlNotationPtr)0x0;
      }
    }
  }
LAB_00177507:
  xmlVErrMemory(ctxt);
  xmlFreeNotation((xmlNotationPtr)table);
  return (xmlNotationPtr)0x0;
}

Assistant:

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt, xmlDtdPtr dtd,
	           const xmlChar *name,
                   const xmlChar *PublicID, const xmlChar *SystemID) {
    xmlNotationPtr ret = NULL;
    xmlNotationTablePtr table;
    int res;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }
    if ((PublicID == NULL) && (SystemID == NULL)) {
	return(NULL);
    }

    /*
     * Create the Notation table if needed.
     */
    table = (xmlNotationTablePtr) dtd->notations;
    if (table == NULL) {
	xmlDictPtr dict = NULL;
	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;

        dtd->notations = table = xmlHashCreateDict(0, dict);
        if (table == NULL)
            goto mem_error;
    }

    ret = (xmlNotationPtr) xmlMalloc(sizeof(xmlNotation));
    if (ret == NULL)
        goto mem_error;
    memset(ret, 0, sizeof(xmlNotation));

    /*
     * fill the structure.
     */
    ret->name = xmlStrdup(name);
    if (ret->name == NULL)
        goto mem_error;
    if (SystemID != NULL) {
        ret->SystemID = xmlStrdup(SystemID);
        if (ret->SystemID == NULL)
            goto mem_error;
    }
    if (PublicID != NULL) {
        ret->PublicID = xmlStrdup(PublicID);
        if (ret->PublicID == NULL)
            goto mem_error;
    }

    /*
     * Validity Check:
     * Check the DTD for previous declarations of the ATTLIST
     */
    res = xmlHashAdd(table, name, ret);
    if (res <= 0) {
        if (res < 0)
            goto mem_error;
#ifdef LIBXML_VALID_ENABLED
        xmlErrValid(ctxt, XML_DTD_NOTATION_REDEFINED,
                    "xmlAddNotationDecl: %s already defined\n",
                    (const char *) name);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeNotation(ret);
	return(NULL);
    }
    return(ret);

mem_error:
    xmlVErrMemory(ctxt);
    xmlFreeNotation(ret);
    return(NULL);
}